

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char-test.c++
# Opt level: O2

void __thiscall kj::parse::anon_unknown_0::TestCase376::run(TestCase376 *this)

{
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 *b;
  bool bVar1;
  long lVar2;
  Bits64 *pBVar3;
  Sequence_<kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>
  *pSVar4;
  Input input;
  AddFailureAdapter local_98;
  Maybe<kj::String> result;
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>,_kj::parse::_::ArrayToString>
  parser;
  
  pBVar3 = &DAT_00423158;
  pSVar4 = (Sequence_<kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>
            *)&parser;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pSVar4->first).subParser.first.bits[0] = *pBVar3;
    pBVar3 = pBVar3 + 1;
    pSVar4 = &((Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>
                *)&pSVar4->first)->rest;
  }
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "\'hello\'";
  input.end = "";
  input.best = "\'hello\'";
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\''>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\\'>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'x'>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_'\''>_>,_kj::parse::_::ArrayToString>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>(&result,&parser,&input);
  b = &result.ptr.field_1;
  if (result.ptr.isSet == true) {
    bVar1 = operator==("hello",&b->value);
    if (!bVar1 && kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[39],char_const(&)[6],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x180,ERROR,
                 "\"failed: expected \" \"(\\\"hello\\\") == (*value)\", \"hello\", *value",
                 (char (*) [39])"failed: expected (\"hello\") == (*value)",(char (*) [6])0x34580a,
                 &b->value);
    }
  }
  else {
    local_98.handled = false;
    local_98.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
    ;
    local_98.line = 0x182;
    AddFailureAdapter::operator<<(&local_98,(char (*) [28])"Expected \"hello\", got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_98);
  }
  if ((input.pos != input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x184,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  kj::_::NullableValue<kj::String>::~NullableValue(&result.ptr);
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "\'test\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\?\x01\x02\x1cn\'";
  input.end = "";
  input.best = "\'test\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\?\x01\x02\x1cn\'";
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\''>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\\'>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'x'>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_'\''>_>,_kj::parse::_::ArrayToString>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>(&result,&parser,&input);
  if (result.ptr.isSet == true) {
    bVar1 = operator==("test\a\b\f\n\r\t\v\'\"?\x01\x02\x1cn",&b->value);
    if (!bVar1 && kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[71],char_const(&)[19],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x18c,ERROR,
                 "\"failed: expected \" \"(\\\"test\\\\a\\\\b\\\\f\\\\n\\\\r\\\\t\\\\v\\\\\'\\\\\\\"\\\\?\\\\x01\\\\2\\\\34\\\\156\\\") == (*value)\", \"test\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\?\\x01\\2\\34\\156\", *value"
                 ,(char (*) [71])
                  "failed: expected (\"test\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\?\\x01\\2\\34\\156\") == (*value)"
                 ,(char (*) [19])"test\a\b\f\n\r\t\v\'\"?\x01\x02\x1cn",&b->value);
    }
  }
  else {
    local_98.handled = false;
    local_98.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
    ;
    local_98.line = 0x18e;
    AddFailureAdapter::operator<<(&local_98,(char (*) [27])"Expected string, got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_98);
  }
  if ((input.pos != input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,400,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  kj::_::NullableValue<kj::String>::~NullableValue(&result.ptr);
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "\'foo\"bar\'";
  input.end = "";
  input.best = "\'foo\"bar\'";
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\''>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\\'>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'x'>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_'\''>_>,_kj::parse::_::ArrayToString>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>(&result,&parser,&input);
  if (result.ptr.isSet == true) {
    bVar1 = operator==("foo\"bar",&b->value);
    if (!bVar1 && kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[42],char_const(&)[8],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x198,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\\\\\"bar\\\") == (*value)\", \"foo\\\"bar\", *value"
                 ,(char (*) [42])"failed: expected (\"foo\\\"bar\") == (*value)",
                 (char (*) [8])"foo\"bar",&b->value);
    }
  }
  else {
    local_98.handled = false;
    local_98.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
    ;
    local_98.line = 0x19a;
    AddFailureAdapter::operator<<(&local_98,(char (*) [27])"Expected string, got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_98);
  }
  if ((input.pos != input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x19c,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  kj::_::NullableValue<kj::String>::~NullableValue(&result.ptr);
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  return;
}

Assistant:

TEST(CharParsers, SingleQuotedString) {
  constexpr auto parser = singleQuotedString;

  {
    StringPtr text = "\'hello\'";
    Input input(text.begin(), text.end());
    Maybe<String> result = parser(input);
    KJ_IF_MAYBE(value, result) {
      EXPECT_EQ("hello", *value);
    } else {
      ADD_FAILURE() << "Expected \"hello\", got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }